

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

char * __thiscall QMetaEnum::valueToKey(QMetaEnum *this,quint64 value)

{
  uint *puVar1;
  EnumExtendMode modes;
  quint64 qVar2;
  uint index;
  int iVar3;
  
  if (this->mobj == (QMetaObject *)0x0) {
    return (char *)0x0;
  }
  modes = enumExtendMode(this);
  if (modes != Use64Bit) {
    if (modes == ZeroExtend) {
      if (value >> 0x20 != 0) {
        return (char *)0x0;
      }
    }
    else if ((long)(int)value != value) {
      return (char *)0x0;
    }
  }
  iVar3 = 0;
  index = 0;
  while( true ) {
    if ((int)(this->data).d[3] <= (int)index) {
      return (char *)0x0;
    }
    qVar2 = value_helper<EnumExtendMode>(this,index,modes);
    if (qVar2 == value) break;
    index = index + 1;
    iVar3 = iVar3 + 2;
  }
  puVar1 = (this->mobj->d).stringdata;
  return (char *)((ulong)puVar1[(long)(int)(this->mobj->d).data[iVar3 + (this->data).d[4]] * 2] +
                 (long)puVar1);
}

Assistant:

const char *QMetaEnum::valueToKey(quint64 value) const
{
    if (!mobj)
        return nullptr;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return nullptr;

    for (int i = 0; i < int(data.keyCount()); ++i) {
        if (value == value_helper(i, mode))
            return rawStringData(mobj, mobj->d.data[data.data() + 2 * i]);
    }
    return nullptr;
}